

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktChStep.cpp
# Opt level: O2

void __thiscall
KktChStep::passSolution
          (KktChStep *this,vector<double,_std::allocator<double>_> *colVal,
          vector<double,_std::allocator<double>_> *colDu,
          vector<double,_std::allocator<double>_> *rDu)

{
  pointer piVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  vector<int,_std::allocator<int>_> eqIndexOfReduced;
  vector<int,_std::allocator<int>_> eqIndexOfReduROW;
  vector<int,_std::allocator<int>_> cIndex;
  vector<int,_std::allocator<int>_> rIndex;
  allocator_type local_8d;
  value_type local_8c;
  _Vector_base<int,_std::allocator<int>_> local_88;
  _Vector_base<int,_std::allocator<int>_> local_70;
  _Vector_base<int,_std::allocator<int>_> local_58;
  _Vector_base<int,_std::allocator<int>_> local_40;
  
  std::vector<double,_std::allocator<double>_>::resize(&this->colValue,(long)this->RnumCol);
  std::vector<double,_std::allocator<double>_>::resize(&this->colDual,(long)this->RnumCol);
  std::vector<double,_std::allocator<double>_>::resize(&this->rowDual,(long)this->RnumRow);
  this->numRow = (int)((ulong)((long)(rDu->super__Vector_base<double,_std::allocator<double>_>).
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(rDu->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data._M_start) >> 3);
  this->numCol = (int)((ulong)((long)(colDu->super__Vector_base<double,_std::allocator<double>_>).
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(colDu->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data._M_start) >> 3);
  local_58._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_40,(long)this->RnumRow,
             (value_type *)&local_58,(allocator_type *)&local_88);
  local_88._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_58,(long)this->RnumCol,
             (value_type *)&local_88,(allocator_type *)&local_70);
  piVar1 = (this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar8 = 0;
  for (lVar7 = 0; lVar7 < this->RnumRow; lVar7 = lVar7 + 1) {
    if (piVar1[lVar7] != 0) {
      local_40._M_impl.super__Vector_impl_data._M_start[lVar7] = iVar8;
      iVar8 = iVar8 + 1;
    }
  }
  piVar1 = (this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar8 = 0;
  for (lVar7 = 0; lVar7 < this->RnumCol; lVar7 = lVar7 + 1) {
    if (piVar1[lVar7] != 0) {
      *(int *)(CONCAT44(local_58._M_impl.super__Vector_impl_data._M_start._4_4_,
                        local_58._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar7 * 4) =
           iVar8;
      iVar8 = iVar8 + 1;
    }
  }
  local_70._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_88,(long)this->numCol,
             (value_type *)&local_70,(allocator_type *)&local_8c);
  local_8c = -1;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_70,(long)this->numRow,&local_8c,&local_8d);
  iVar8 = 0;
  for (lVar7 = 0; lVar7 < this->RnumCol; lVar7 = lVar7 + 1) {
    if (-1 < *(int *)(CONCAT44(local_58._M_impl.super__Vector_impl_data._M_start._4_4_,
                               local_58._M_impl.super__Vector_impl_data._M_start._0_4_) + lVar7 * 4)
       ) {
      *(int *)(CONCAT44(local_88._M_impl.super__Vector_impl_data._M_start._4_4_,
                        local_88._M_impl.super__Vector_impl_data._M_start._0_4_) + (long)iVar8 * 4)
           = (int)lVar7;
      iVar8 = iVar8 + 1;
    }
  }
  iVar8 = 0;
  for (lVar7 = 0; lVar7 < this->RnumRow; lVar7 = lVar7 + 1) {
    if (-1 < local_40._M_impl.super__Vector_impl_data._M_start[lVar7]) {
      *(int *)(CONCAT44(local_70._M_impl.super__Vector_impl_data._M_start._4_4_,
                        local_70._M_impl.super__Vector_impl_data._M_start._0_4_) + (long)iVar8 * 4)
           = (int)lVar7;
      iVar8 = iVar8 + 1;
    }
  }
  pdVar2 = (colVal->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (colDu->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = 0;
  uVar6 = (ulong)(uint)this->numCol;
  if (this->numCol < 1) {
    uVar6 = uVar9;
  }
  for (; uVar6 != uVar9; uVar9 = uVar9 + 1) {
    iVar8 = *(int *)(CONCAT44(local_88._M_impl.super__Vector_impl_data._M_start._4_4_,
                              local_88._M_impl.super__Vector_impl_data._M_start._0_4_) + uVar9 * 4);
    pdVar3[iVar8] = pdVar2[uVar9];
    pdVar5[iVar8] = pdVar4[uVar9];
  }
  pdVar2 = (rDu->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = 0;
  uVar6 = (ulong)(uint)this->numRow;
  if (this->numRow < 1) {
    uVar6 = uVar9;
  }
  for (; uVar6 != uVar9; uVar9 = uVar9 + 1) {
    pdVar3[*(int *)(CONCAT44(local_70._M_impl.super__Vector_impl_data._M_start._4_4_,
                             local_70._M_impl.super__Vector_impl_data._M_start._0_4_) + uVar9 * 4)]
         = pdVar2[uVar9];
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_70);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_88);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_40);
  return;
}

Assistant:

void KktChStep::passSolution(const vector<double>& colVal, const vector<double>& colDu, const vector<double>& rDu) {

	colValue.resize(RnumCol);
	colDual.resize(RnumCol);
	rowDual.resize(RnumRow);
	
	numRow = rDu.size();
	numCol = colDu.size();
	//arrays to keep track of indices
	vector<int> rIndex(RnumRow, -1);
	vector<int> cIndex(RnumCol, -1);
	int nR = 0;
	int nC = 0;
	
	for (int i=0;i<RnumRow;i++)
		if (flagRow[i]) {
			rIndex[i] = nR;
			nR++;
			}
			
	for (int i=0;i<RnumCol;i++)
		if (flagCol[i]) {
			cIndex[i] = nC;
			nC++;
		}
		
	//set corresponding parts of solution vectors:
	int j=0;
	vector<int> eqIndexOfReduced(numCol, -1);
	vector<int> eqIndexOfReduROW(numRow, -1);
	for (int i=0;i<RnumCol;i++)
		if (cIndex[i]>-1) {
			eqIndexOfReduced[j] = i;
			j++;
		}
	j=0;
	for (int i=0;i<RnumRow;i++)
		if (rIndex[i]>-1) {
			eqIndexOfReduROW[j] = i;
			j++;
		}
	
	for (int i=0;i<numCol;i++) {
		colValue[eqIndexOfReduced[i]] = colVal[i];
		colDual[eqIndexOfReduced[i]] = colDu[i];
	}
	
	for (int i=0;i<numRow;i++)
		rowDual[eqIndexOfReduROW[i]] = rDu[i];
	
}